

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.cc
# Opt level: O3

bool __thiscall
sptk::RealValuedFastFourierTransform::Run
          (RealValuedFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  ulong uVar1;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  pointer pdVar10;
  int iVar11;
  size_type __new_size;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar8 = false;
  bVar9 = false;
  if (((buffer != (Buffer *)0x0) &&
      (bVar9 = bVar8, imag_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar11 = this->num_order_;
    uVar1 = (long)iVar11 + 1;
    if ((long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar1) {
      this_00 = &buffer->real_part_input_;
      __new_size = (size_type)this->half_fft_length_;
      if ((long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
        __new_size = (size_type)this->half_fft_length_;
      }
      this_01 = &buffer->imag_part_input_;
      if ((long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
      }
      uVar12 = (ulong)this->fft_length_;
      if ((ulong)((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) < uVar12) {
        std::vector<double,_std::allocator<double>_>::reserve(real_part_output,uVar12);
        uVar12 = (ulong)this->fft_length_;
      }
      if ((ulong)((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) < uVar12) {
        std::vector<double,_std::allocator<double>_>::reserve(imag_part_output,uVar12);
      }
      pdVar10 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (-1 < iVar11) {
        pdVar4 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = 0;
        do {
          *(double *)((long)pdVar10 + uVar12 * 4) = pdVar4[uVar12];
          if ((ulong)(long)iVar11 <= uVar12) break;
          *(double *)
           ((long)(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + uVar12 * 4) = pdVar4[uVar12 + 1];
          uVar12 = uVar12 + 2;
        } while ((int)uVar12 <= iVar11);
        pdVar10 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pdVar10 = pdVar10 + ((iVar11 - (iVar11 + 2 >> 0x1f)) + 2 >> 1);
      pdVar4 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pdVar10 != pdVar4) {
        memset(pdVar10,0,((long)pdVar4 + (-8 - (long)pdVar10) & 0xfffffffffffffff8U) + 8);
      }
      pdVar4 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pdVar10 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start +
                ((int)(((uint)(uVar1 >> 0x1f) & 1) + (int)uVar1) >> 1);
      if (pdVar10 != pdVar4) {
        memset(pdVar10,0,((long)pdVar4 + (-8 - (long)pdVar10) & 0xfffffffffffffff8U) + 8);
      }
      bVar9 = FastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,this_01,real_part_output,
                         imag_part_output);
      if (bVar9) {
        std::vector<double,_std::allocator<double>_>::resize
                  (real_part_output,(long)this->fft_length_);
        std::vector<double,_std::allocator<double>_>::resize
                  (imag_part_output,(long)this->fft_length_);
        pdVar5 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = this->fft_length_;
        lVar13 = (long)iVar11;
        iVar3 = this->half_fft_length_;
        lVar16 = (long)iVar3;
        pdVar5[lVar16] = *pdVar5 - *pdVar6;
        *pdVar5 = *pdVar5 + *pdVar6;
        pdVar6[lVar16] = 0.0;
        *pdVar6 = 0.0;
        bVar9 = true;
        if (1 < lVar16) {
          pdVar10 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar14 = iVar11 + 3;
          if (-1 < iVar11) {
            iVar14 = iVar11;
          }
          iVar11 = iVar3 + -1;
          lVar7 = (long)(iVar14 >> 2) * 8 + 8;
          lVar17 = -1;
          lVar15 = 0;
          do {
            dVar2 = *(double *)((long)pdVar5 + lVar15 + 8);
            dVar18 = dVar2 - pdVar5[lVar16 + lVar17];
            dVar19 = *(double *)((long)pdVar6 + lVar15 + 8) + pdVar6[lVar16 + lVar17];
            pdVar5[lVar13 + lVar17] =
                 ((*(double *)((long)pdVar10 + lVar15 + lVar7) * dVar19 +
                  dVar2 + pdVar5[lVar16 + lVar17]) -
                 *(double *)((long)pdVar10 + lVar15 + 8) * dVar18) * 0.5;
            pdVar6[lVar13 + lVar17] =
                 (dVar18 * *(double *)((long)pdVar10 + lVar15 + lVar7) +
                 dVar19 * *(double *)((long)pdVar10 + lVar15 + 8) +
                 (pdVar6[lVar16 + lVar17] - *(double *)((long)pdVar6 + lVar15 + 8))) * 0.5;
            lVar17 = lVar17 + -1;
            lVar15 = lVar15 + 8;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          if (1 < iVar3) {
            lVar16 = 1;
            do {
              lVar13 = lVar13 + -1;
              pdVar5[lVar16] = pdVar5[lVar13];
              pdVar6[lVar16] = -pdVar6[lVar13];
              lVar16 = lVar16 + 1;
            } while (iVar3 != (int)lVar16);
          }
        }
      }
      else {
        bVar9 = false;
      }
    }
  }
  return bVar9;
}

Assistant:

bool RealValuedFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    RealValuedFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_order_ + 1);
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(input_length) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->real_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->real_part_input_.resize(half_fft_length_);
  }
  if (buffer->imag_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->imag_part_input_.resize(half_fft_length_);
  }
  if (real_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    real_part_output->reserve(fft_length_);
  }
  if (imag_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    imag_part_output->reserve(fft_length_);
  }

  // Copy input and fill zero.
  for (int i(0), j(0); i < input_length; ++j) {
    buffer->real_part_input_[j] = real_part_input[i++];
    if (input_length <= i) break;
    buffer->imag_part_input_[j] = real_part_input[i++];
  }
  std::fill(buffer->real_part_input_.begin() + (input_length + 1) / 2,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + input_length / 2,
            buffer->imag_part_input_.end(), 0.0);

  // Run fast Fourier transform.
  if (!fast_fourier_transform_.Run(buffer->real_part_input_,
                                   buffer->imag_part_input_, real_part_output,
                                   imag_part_output)) {
    return false;
  }
  real_part_output->resize(fft_length_);
  imag_part_output->resize(fft_length_);

  double* x(&((*real_part_output)[0]));
  double* y(&((*imag_part_output)[0]));
  double* xp(x);
  double* yp(y);
  double* xq(xp + fft_length_);
  double* yq(yp + fft_length_);
  *(xp + half_fft_length_) = *xp - *yp;
  *xp = *xp + *yp;
  *(yp + half_fft_length_) = 0.0;
  *yp = 0.0;

  const double* sinp(&(sine_table_[0]));
  const double* cosp(&(sine_table_[0]) + fft_length_ / 4);
  for (int i(1), j(half_fft_length_ - 2); i < half_fft_length_; ++i, j -= 2) {
    ++xp;
    ++yp;
    ++sinp;
    ++cosp;
    const double xt(*xp - *(xp + j));
    const double yt(*yp + *(yp + j));
    *(--xq) = (*xp + *(xp + j) + *cosp * yt - *sinp * xt) * 0.5;
    *(--yq) = (-*yp + *(yp + j) + *sinp * yt + *cosp * xt) * 0.5;
  }

  xp = x + 1;
  yp = y + 1;
  xq = x + fft_length_;
  yq = y + fft_length_;
  for (int i(1); i < half_fft_length_; ++i) {
    *xp++ = *(--xq);
    *yp++ = -(*(--yq));
  }

  return true;
}